

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O2

void __thiscall OpenMD::SwitchingFunction::SwitchingFunction(SwitchingFunction *this)

{
  __shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->functionType_ = cubic;
  this->haveSpline_ = false;
  this->isCubic_ = true;
  this->np_ = 0x96;
  (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<OpenMD::CubicSpline>();
  std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->switchSpline_).
              super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

SwitchingFunction::SwitchingFunction() :
      functionType_(cubic), haveSpline_(false), isCubic_(true), np_(150) {
    switchSpline_ = std::make_shared<CubicSpline>();
  }